

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall Json::StyledStreamWriter::writeArrayValue(StyledStreamWriter *this,Value *value)

{
  ostream *poVar1;
  bool bVar2;
  reference pvVar3;
  size_type sVar4;
  uint local_b0;
  allocator<char> local_a9;
  uint index_1;
  Value *local_88;
  Value *childValue;
  uint index;
  bool hasChildValue;
  undefined1 local_55;
  bool isArrayMultiLine;
  allocator<char> local_41;
  String local_40;
  ArrayIndex local_1c;
  Value *pVStack_18;
  uint size;
  Value *value_local;
  StyledStreamWriter *this_local;
  
  pVStack_18 = value;
  value_local = (Value *)this;
  local_1c = Value::size(value);
  if (local_1c == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"[]",&local_41);
    pushValue(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  else {
    local_55 = isMultilineArray(this,pVStack_18);
    if ((bool)local_55) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&index,"[",(allocator<char> *)((long)&childValue + 7));
      writeWithIndent(this,(String *)&index);
      std::__cxx11::string::~string((string *)&index);
      std::allocator<char>::~allocator((allocator<char> *)((long)&childValue + 7));
      indent(this);
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->childValues_);
      childValue._6_1_ = (bVar2 ^ 0xffU) & 1;
      childValue._0_4_ = 0;
      while( true ) {
        local_88 = Value::operator[](pVStack_18,(ArrayIndex)childValue);
        writeCommentBeforeValue(this,local_88);
        if ((childValue._6_1_ & 1) == 0) {
          if (((byte)this->field_0x68 >> 1 & 1) == 0) {
            writeIndent(this);
          }
          this->field_0x68 = this->field_0x68 & 0xfd | 2;
          writeValue(this,local_88);
          this->field_0x68 = this->field_0x68 & 0xfd;
        }
        else {
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&this->childValues_,(ulong)(ArrayIndex)childValue);
          writeWithIndent(this,pvVar3);
        }
        childValue._0_4_ = (ArrayIndex)childValue + 1;
        if ((ArrayIndex)childValue == local_1c) break;
        std::operator<<(this->document_,",");
        writeCommentAfterValueOnSameLine(this,local_88);
      }
      writeCommentAfterValueOnSameLine(this,local_88);
      unindent(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&index_1,"]",&local_a9);
      writeWithIndent(this,(String *)&index_1);
      std::__cxx11::string::~string((string *)&index_1);
      std::allocator<char>::~allocator(&local_a9);
    }
    else {
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->childValues_);
      if (sVar4 != local_1c) {
        __assert_fail("childValues_.size() == size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_writer.cpp"
                      ,0x2fa,"void Json::StyledStreamWriter::writeArrayValue(const Value &)");
      }
      std::operator<<(this->document_,"[ ");
      for (local_b0 = 0; local_b0 < local_1c; local_b0 = local_b0 + 1) {
        if (local_b0 != 0) {
          std::operator<<(this->document_,", ");
        }
        poVar1 = this->document_;
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->childValues_,(ulong)local_b0);
        std::operator<<(poVar1,(string *)pvVar3);
      }
      std::operator<<(this->document_," ]");
    }
  }
  return;
}

Assistant:

void StyledStreamWriter::writeArrayValue(const Value& value) {
  unsigned size = value.size();
  if (size == 0)
    pushValue("[]");
  else {
    bool isArrayMultiLine = isMultilineArray(value);
    if (isArrayMultiLine) {
      writeWithIndent("[");
      indent();
      bool hasChildValue = !childValues_.empty();
      unsigned index = 0;
      for (;;) {
        const Value& childValue = value[index];
        writeCommentBeforeValue(childValue);
        if (hasChildValue)
          writeWithIndent(childValues_[index]);
        else {
          if (!indented_)
            writeIndent();
          indented_ = true;
          writeValue(childValue);
          indented_ = false;
        }
        if (++index == size) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        *document_ << ",";
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("]");
    } else // output on a single line
    {
      assert(childValues_.size() == size);
      *document_ << "[ ";
      for (unsigned index = 0; index < size; ++index) {
        if (index > 0)
          *document_ << ", ";
        *document_ << childValues_[index];
      }
      *document_ << " ]";
    }
  }
}